

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDbgSetImportId(DebugInfoManager *this)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  
  pIVar1 = this->context_;
  if ((pIVar1->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar1);
  }
  uVar2 = ((pIVar1->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
          extinst_importid_OpenCL100DebugInfo_;
  if (uVar2 == 0) {
    pIVar1 = this->context_;
    if ((pIVar1->feature_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
        .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
        (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar1);
    }
    uVar2 = ((pIVar1->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
            extinst_importid_Shader100DebugInfo_;
  }
  return uVar2;
}

Assistant:

uint32_t DebugInfoManager::GetDbgSetImportId() {
  uint32_t setId =
      context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo();
  if (setId == 0) {
    setId =
        context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo();
  }
  return setId;
}